

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
cfd::core::ConfidentialTransaction::GetTxOutIndexList
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          ConfidentialTransaction *this,Script *locking_script)

{
  iterator __position;
  int iVar1;
  pointer pCVar2;
  CfdException *this_00;
  bool bVar3;
  string search_str;
  uint local_ac;
  string local_a8;
  string local_88;
  Script local_68;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Script::GetHex_abi_cxx11_(&local_88,locking_script);
  local_ac = 0;
  pCVar2 = (this->vout_).
           super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->vout_).
                          super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2) >> 3) *
      -0x42108421 != 0) {
    do {
      AbstractTxOut::GetLockingScript(&local_68,&pCVar2[local_ac].super_AbstractTxOut);
      Script::GetHex_abi_cxx11_(&local_a8,&local_68);
      if (local_88._M_string_length == local_a8._M_string_length) {
        if (local_88._M_string_length == 0) {
          bVar3 = true;
        }
        else {
          iVar1 = bcmp(local_88._M_dataplus._M_p,local_a8._M_dataplus._M_p,local_88._M_string_length
                      );
          bVar3 = iVar1 == 0;
        }
      }
      else {
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p);
      }
      Script::~Script(&local_68);
      if (bVar3) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)__return_storage_ptr__,
                     __position,&local_ac);
        }
        else {
          *__position._M_current = local_ac;
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      local_ac = local_ac + 1;
      pCVar2 = (this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (local_ac <
             (uint)((int)((ulong)((long)(this->vout_).
                                        super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2)
                         >> 3) * -0x42108421));
  }
  if ((__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    return __return_storage_ptr__;
  }
  local_68._vptr_Script = (_func_int **)0x5ec8a3;
  local_68.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x5d6;
  local_68.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = "GetTxOutIndexList";
  logger::log<>((CfdSourceLocation *)&local_68,kCfdLogLevelWarning,"locking script is not found.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_68._vptr_Script =
       (_func_int **)
       ((long)&local_68.script_data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data + 8);
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"locking script is not found.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)&local_68);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<uint32_t> ConfidentialTransaction::GetTxOutIndexList(
    const Script &locking_script) const {
  std::vector<uint32_t> result;
  std::string search_str = locking_script.GetHex();
  uint32_t index = 0;
  for (; index < static_cast<uint32_t>(vout_.size()); ++index) {
    if (search_str == vout_[index].GetLockingScript().GetHex()) {
      result.push_back(index);
    }
  }
  if (result.empty()) {
    warn(CFD_LOG_SOURCE, "locking script is not found.");
    throw CfdException(
        kCfdIllegalArgumentError, "locking script is not found.");
  }
  return result;
}